

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM1IPROC p_Var4;
  PFNGLUNIFORM3FVPROC p_Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLint GVar9;
  GLFWwindow *handle;
  undefined4 uVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 in_XMM3_Qa;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_26c;
  float local_268;
  int h;
  int w;
  scene_t scene;
  double mouse [2];
  float rotationYX [16];
  char *e;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178 [13];
  float fStack_144;
  float local_140;
  undefined4 local_13c;
  float local_138 [6];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  float view [16];
  float rotationX [16];
  float rotationY [16];
  
  github111116::ConsoleLogger::info<char[10],int>(&console,(char (*) [10])"SH order:",&shorder);
  github111116::ConsoleLogger::info<char[14],char[10]>
            (&console,(char (*) [14])"shexp method:",(char (*) [10])"shexp_HYB");
  if (1 < argc) {
    github111116::ConsoleLogger::warn<char[18]>(&console,(char (*) [18])"single image mode");
  }
  glfwSetErrorCallback(error_callback);
  iVar6 = glfwInit();
  if (iVar6 == 0) {
    iVar6 = 1;
  }
  else {
    glfwWindowHint(0x21001,8);
    glfwWindowHint(0x21002,8);
    glfwWindowHint(0x21003,8);
    glfwWindowHint(0x21004,8);
    glfwWindowHint(0x21005,0x20);
    glfwWindowHint(0x21006,-1);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,1);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    iVar6 = 1;
    glfwWindowHint(0x22007,1);
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x20003,0);
    handle = glfwCreateWindow(0x3c0,0x21c,"Spherical Harmonics Playground",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(0);
      ImGui_ImplGlfwGL3_Init(handle,true);
      scene.mesh.vao = 0;
      scene.mesh.vbo = 0;
      scene.mesh.vertices = 0;
      scene.mesh.max_magn = 0.0;
      scene.mesh.program = 0;
      scene.mesh.u_view = 0;
      scene.mesh.u_projection = 0;
      scene.mesh.LHtexture = 0;
      scene.mesh.gammasize = 0;
      scene.mesh.sqrgammasize = 0;
      initScene(&scene);
      std::chrono::_V2::system_clock::now();
      while( true ) {
        fVar16 = (float)in_XMM3_Qa;
        iVar6 = glfwWindowShouldClose(handle);
        if (iVar6 != 0) break;
        glfwPollEvents();
        iVar6 = glfwGetKey(handle,0x52);
        if (iVar6 == 1) {
          destroyScene(&scene);
          initScene(&scene);
        }
        ImGui_ImplGlfwGL3_NewFrame();
        pIVar2 = GImGui;
        (pIVar2->SetNextWindowSizeVal).x = 300.0;
        (pIVar2->SetNextWindowSizeVal).y = 300.0;
        pIVar2->SetNextWindowSizeCond = 4;
        ImGui::Begin("Coefficients",&main::show_another_window,0);
        fVar15 = (GImGui->IO).Framerate;
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
                    SUB84((double)(1000.0 / fVar15),0),SUB84((double)fVar15,0));
        ImGui::End();
        glfwGetFramebufferSize(handle,&w,&h);
        (*glad_glViewport)(0,0,w,h);
        IVar1 = GImGui->ActiveId;
        if ((fpsCameraViewMatrix(GLFWwindow*,float*,bool)::rotation == '\0') &&
           (iVar6 = __cxa_guard_acquire(&fpsCameraViewMatrix(GLFWwindow*,float*,bool)::rotation),
           iVar6 != 0)) {
          fVar15 = -180.0 / PI;
          fVar17 = atan2f(_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1,
                          SQRT((_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0 + -0.3) *
                               (_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0 + -0.3) +
                               _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2 *
                               _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2));
          _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0 = fVar17 * fVar15;
          fVar17 = 180.0 / PI;
          fVar15 = atan2f(_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0 + -0.3,
                          _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2);
          _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1 = fVar15 * fVar17;
          __cxa_guard_release(&fpsCameraViewMatrix(GLFWwindow*,float*,bool)::rotation);
        }
        glfwGetCursorPos(handle,mouse,mouse + 1);
        if (IVar1 == 0) {
          iVar6 = glfwGetMouseButton(handle,0);
          uVar10 = SUB84(mouse[0],0);
          uVar12 = (undefined4)((ulong)mouse[0] >> 0x20);
          uVar13 = SUB84(mouse[1],0);
          uVar14 = (undefined4)((ulong)mouse[1] >> 0x20);
          if (iVar6 == 1) {
            _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0 =
                 _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0 +
                 (float)(mouse[1] - _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_1) * -0.2;
            fVar16 = (float)(mouse[0] - _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_0) *
                     -0.2 + _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1;
            _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1 = fVar16;
          }
        }
        else {
          uVar10 = SUB84(mouse[0],0);
          uVar12 = (undefined4)((ulong)mouse[0] >> 0x20);
          uVar13 = SUB84(mouse[1],0);
          uVar14 = (undefined4)((ulong)mouse[1] >> 0x20);
        }
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_0 = (double)CONCAT44(uVar12,uVar10);
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_1 = (double)CONCAT44(uVar14,uVar13);
        m_rotation44(rotationX,_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0,1.0,0.0,fVar16)
        ;
        m_rotation44(rotationY,_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1,0.0,1.0,fVar16)
        ;
        m_mul44(rotationYX,rotationY,rotationX);
        iVar6 = glfwGetKey(handle,0x154);
        fVar15 = 0.0;
        fVar16 = 0.0;
        fVar17 = 0.0;
        if (IVar1 == 0) {
          iVar7 = glfwGetKey(handle,0x57);
          iVar8 = glfwGetKey(handle,0x53);
          fVar11 = *(float *)(&DAT_00188a68 + (ulong)(iVar6 == 1) * 4);
          fVar16 = 0.0 - fVar11;
          fVar15 = fVar16;
          if (iVar7 != 1) {
            fVar15 = 0.0;
          }
          local_268 = fVar11;
          if (iVar8 != 1) {
            local_268 = -0.0;
          }
          iVar6 = glfwGetKey(handle,0x41);
          iVar7 = glfwGetKey(handle,0x44);
          fVar17 = fVar16;
          if (iVar6 != 1) {
            fVar17 = 0.0;
          }
          local_26c = fVar11;
          if (iVar7 != 1) {
            local_26c = -0.0;
          }
          iVar6 = glfwGetKey(handle,0x45);
          if (iVar6 != 1) {
            fVar16 = 0.0;
          }
          iVar6 = glfwGetKey(handle,0x51);
          fVar15 = fVar15 + local_268;
          fVar17 = fVar17 + local_26c;
          if (iVar6 == 1) {
            fVar16 = fVar16 + fVar11;
          }
        }
        local_198 = rotationYX[2];
        local_194 = rotationYX[6];
        local_190 = rotationYX[10];
        local_18c = rotationYX[0xe];
        local_188 = rotationYX[3];
        local_184 = rotationYX[7];
        local_180 = rotationYX[0xb];
        fVar11 = 1.0 / (rotationYX[0xb] * fVar15 + rotationYX[3] * fVar17 + fVar16 * rotationYX[7] +
                       rotationYX[0xf]);
        local_17c = rotationYX[0xf];
        e._0_4_ = (float)rotationYX._0_8_;
        local_1a8 = SUB84(rotationYX._0_8_,4);
        e._4_4_ = (float)rotationYX._16_8_;
        fStack_1a4 = SUB84(rotationYX._16_8_,4);
        fStack_1b0 = (float)rotationYX._32_8_;
        fStack_1a0 = SUB84(rotationYX._32_8_,4);
        fStack_1ac = (float)rotationYX._48_8_;
        fStack_19c = SUB84(rotationYX._48_8_,4);
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0 =
             fVar11 * (fVar15 * fStack_1b0 + fVar17 * e._0_4_ + fVar16 * e._4_4_ + fStack_1ac) +
             _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0;
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1 =
             fVar11 * (fVar15 * fStack_1a0 + fVar17 * local_1a8 + fVar16 * fStack_1a4 + fStack_19c)
             + _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1;
        local_178[0xc] = -_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0;
        fStack_144 = -_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1;
        local_178[0] = 1.0;
        local_178[1] = 0.0;
        local_178[2] = 0.0;
        local_178[3] = 0.0;
        local_178[4] = 0.0;
        local_178[5] = 1.0;
        local_178[6] = 0.0;
        local_178[7] = 0.0;
        local_178[8] = 0.0;
        local_178[9] = 0.0;
        local_178[10] = 1.0;
        local_178[0xb] = 0.0;
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2 =
             (rotationYX[10] * fVar15 + rotationYX[2] * fVar17 + fVar16 * rotationYX[6] +
             rotationYX[0xe]) * fVar11 + _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2;
        local_140 = -_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2;
        local_13c = 0x3f800000;
        m_mul44(view,(float *)&e,local_178);
        fVar15 = (float)w;
        fVar16 = (float)h;
        local_138[5] = tanf((FOV * 3.1415927) / 360.0);
        in_XMM3_Qa = 0x3f800000;
        local_138[5] = 1.0 / local_138[5];
        local_138[0] = local_138[5] / (fVar15 / fVar16);
        local_138[1] = 0.0;
        local_138[2] = 0.0;
        local_138[3] = 0.0;
        local_138[4] = 0.0;
        local_120 = 0;
        uStack_118 = 0;
        local_110 = 0xbf800000bf80068e;
        uStack_108 = 0;
        local_100 = 0xbca3db3c;
        (*glad_glClearColor)(0.0,0.0,0.0,1.0);
        (*glad_glClear)(0x4100);
        (*glad_glEnable)(0xb71);
        (*glad_glDepthFunc)(0x203);
        (*glad_glUseProgram)(scene.mesh.program);
        (*glad_glUniformMatrix4fv)(scene.mesh.u_projection,1,'\0',local_138);
        (*glad_glUniformMatrix4fv)(scene.mesh.u_view,1,'\0',view);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_sh_lut");
        (*p_Var4)(GVar9,3);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_log_lut");
        (*p_Var4)(GVar9,1);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_ab_lut");
        (*p_Var4)(GVar9,2);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_sphere");
        (*p_Var4)(GVar9,4);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_ratio");
        (*p_Var4)(GVar9,5);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_sparse");
        (*p_Var4)(GVar9,0xf);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_sqrsparse");
        (*p_Var4)(GVar9,0x10);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_LH");
        (*p_Var4)(GVar9,8);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"u_LHcubemap");
        (*p_Var4)(GVar9,0);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"albedo_map");
        (*p_Var4)(GVar9,0x14);
        p_Var3 = glad_glUniform1f;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"max_magn");
        (*p_Var3)(GVar9,scene.mesh.max_magn);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"gammasize");
        (*p_Var4)(GVar9,scene.mesh.gammasize);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"sqrgammasize");
        (*p_Var4)(GVar9,scene.mesh.sqrgammasize);
        p_Var5 = glad_glUniform3fv;
        GVar9 = (*glad_glGetUniformLocation)(scene.mesh.program,"objcolor");
        (*p_Var5)(GVar9,10,&obj_color[0].x);
        (*glad_glBindVertexArray)(scene.mesh.vao);
        (*glad_glDrawArrays)(4,0,scene.mesh.vertices);
        if (argc < 2) {
          ImGui::Render();
        }
        glfwSwapBuffers(handle);
        if (1 < argc) {
          saveImage("window_save.png",handle);
          break;
        }
        std::chrono::_V2::system_clock::now();
      }
      destroyScene(&scene);
      ImGui_ImplGlfwGL3_Shutdown();
      glfwDestroyWindow(handle);
      glfwTerminate();
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
{
	console.info("SH order:", shorder);
	console.info("shexp method:", SHEXP_METHOD);
	bool single_image_mode = (argc>1);
	if (single_image_mode) {
		console.warn("single image mode");
	}
	try {
	glfwSetErrorCallback(error_callback);
	if (!glfwInit()) return 1;
	glfwWindowHint(GLFW_RED_BITS, 8);
	glfwWindowHint(GLFW_GREEN_BITS, 8);
	glfwWindowHint(GLFW_BLUE_BITS, 8);
	glfwWindowHint(GLFW_ALPHA_BITS, 8);
	glfwWindowHint(GLFW_DEPTH_BITS, 32);
	glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
	glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);
	glfwWindowHint(GLFW_SAMPLES, 4);
	glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);
	GLFWwindow *window = glfwCreateWindow(960, 540, "Spherical Harmonics Playground", NULL, NULL);
	if (!window) return 1;
	glfwMakeContextCurrent(window);
	gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
	glfwSwapInterval(0); // vsync disabled

	ImGui_ImplGlfwGL3_Init(window, true);

	scene_t scene = {0};
	initScene(&scene);
	// display_texture::init();
	auto lasttime = std::chrono::system_clock::now();
	bool firstframe = true;

	while (!glfwWindowShouldClose(window))
	{
		glfwPollEvents();
		if (glfwGetKey(window, GLFW_KEY_R) == GLFW_PRESS)
		{
			destroyScene(&scene);
			initScene(&scene);
		}
		ImGui_ImplGlfwGL3_NewFrame();

		ImGui::SetNextWindowSize(ImVec2(300, 300), ImGuiSetCond_FirstUseEver);
		static bool show_another_window = true;
		ImGui::Begin("Coefficients", &show_another_window);
		// for (int i = 0; i < 9; i++)
		// {
		// 	char name[] = "[?]";
		// 	name[1] = i + '0';
		// 	m_vec3 remapped = m_scale3(m_add3(scene.mesh.coefficients[i], m_v3(1.0f, 1.0f, 1.0f)), 0.5f);
		// 	ImGui::ColorEdit3(name, &remapped.x);
		// 	scene.mesh.coefficients[i] = m_sub3(m_scale3(remapped, 2.0f), m_v3(1.0f, 1.0f, 1.0f));
		// }
		ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
		ImGui::End();

		int w, h;
		glfwGetFramebufferSize(window, &w, &h);
		glViewport(0, 0, w, h);
		float view[16], projection[16];
		fpsCameraViewMatrix(window, view, ImGui::IsAnyItemActive());
		m_perspective44(projection, FOV, (float)w / (float)h, 0.01f, 100.0f);
		// console.warn("perspective");
		// for (int i=0; i<16; ++i)
		// 	console.log(projection[i]);
		drawScene(&scene, view, projection);
		// display_texture::draw();
		if (!single_image_mode) {
			ImGui::Render();
		}
		glfwSwapBuffers(window);
		if (single_image_mode) {
			saveImage("window_save.png", window);
			break;
		}
		// framerate
		auto now = std::chrono::system_clock::now();
		if (firstframe) {
			firstframe = false;
		}
		else {
			std::chrono::duration<double> seconds = now - lasttime;
			// console.log("frame draw time:", seconds.count());
		}
		lasttime = now;
	}

	destroyScene(&scene);
	ImGui_ImplGlfwGL3_Shutdown();
	glfwDestroyWindow(window);
	glfwTerminate();
	}
	catch (const char* e) {
		console.error(e);
		return 1;
	}
}